

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1236:13),_kj::_::PropagateException>_>
::dispose(Own<kj::_::TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1236:13),_kj::_::PropagateException>_>
          *this)

{
  TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1236:13),_kj::_::PropagateException>
  *object;
  TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1236:13),_kj::_::PropagateException>
  *ptrCopy;
  Own<kj::_::TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1236:13),_kj::_::PropagateException>_>
  *this_local;
  
  object = this->ptr;
  if (object != (TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1236:13),_kj::_::PropagateException>
                 *)0x0) {
    this->ptr = (TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1236:13),_kj::_::PropagateException>
                 *)0x0;
    Disposer::
    dispose<kj::_::TransformPromiseNode<capnp::Response<capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>,capnp::Response<capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>,capnp::_::(anonymous_namespace)::TestCase1206::run()::__0,kj::_::PropagateException>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }